

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

FastPattern *
trieste::detail::FastPattern::match_opt(FastPattern *__return_storage_ptr__,FastPattern *pattern)

{
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_78;
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  local_40 [48];
  
  if (((pattern->starts)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     ((pattern->pass_through & 1U) == 0)) {
    FastPattern(__return_storage_ptr__,pattern);
  }
  else {
    std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::_Rb_tree(local_40,(_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                         *)pattern);
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78._M_t._M_impl._0_8_ = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    FastPattern(__return_storage_ptr__,
                (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                local_40,&local_78,true);
    std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                 *)&local_78);
    std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::~_Rb_tree(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static FastPattern match_opt(const FastPattern& pattern)
      {
        if (pattern.any_first())
          return pattern;

        return FastPattern(pattern.starts, {}, true);
      }